

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void pearants(int step,double *AAA,int hit,double *points_x,double *points_y,double *points_z,
             double dist,double *empty_cubs,int *empty_index)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  bool bVar5;
  int local_6c;
  int local_68;
  int m;
  int k;
  int j;
  int i;
  int check;
  double z;
  double y;
  double x;
  double dist_local;
  double *points_z_local;
  double *points_y_local;
  double *points_x_local;
  int hit_local;
  double *AAA_local;
  int step_local;
  
  *empty_index = 0;
  k = 0;
  do {
    if (step <= k) {
      return;
    }
    dVar1 = AAA[k];
    for (m = 0; m < step; m = m + 1) {
      dVar2 = AAA[m];
      for (local_68 = 0; local_68 < step; local_68 = local_68 + 1) {
        bVar5 = false;
        for (local_6c = 0; local_6c <= hit; local_6c = local_6c + 1) {
          if ((((dVar1 <= points_x[local_6c]) && (points_x[local_6c] <= dVar1 + dist)) &&
              (dVar2 <= points_y[local_6c])) &&
             (((points_y[local_6c] <= dVar2 + dist && (AAA[local_68] <= points_z[local_6c])) &&
              (points_z[local_6c] <= AAA[local_68] + dist)))) {
            bVar5 = true;
            break;
          }
        }
        if (!bVar5) {
          dVar3 = AAA[k];
          iVar4 = *empty_index;
          *empty_index = iVar4 + 1;
          empty_cubs[iVar4] = dVar3;
          dVar3 = AAA[m];
          iVar4 = *empty_index;
          *empty_index = iVar4 + 1;
          empty_cubs[iVar4] = dVar3;
          dVar3 = AAA[local_68];
          iVar4 = *empty_index;
          *empty_index = iVar4 + 1;
          empty_cubs[iVar4] = dVar3;
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

void pearants(int step,double *AAA,int hit,double *points_x,double *points_y,
			  double *points_z,double dist,double *empty_cubs,int &empty_index)
{
	double x,y,z;
	int check;
	empty_index=0;
	for (int i = 0; i < step; i++)
	{
		x=AAA[i];
		for (int j = 0; j < step; j++)
		{
			y=AAA[j];
			for (int k = 0; k < step; k++)
			{
				z=AAA[k];
				check=0;
				for (int m = 0; m <= hit; m++)
				{
					if (points_x[m]>= x &&points_x[m]<= x+dist)
					{
						if (points_y[m]>=y &&points_y[m]<= y+dist)
						{
							if (points_z[m]>=z &&points_z[m]<= z+dist)
							{
								check=1;
								break;
							}

						}

					}

				}
				if (check==0)
				{
					empty_cubs[empty_index++]=AAA[i];
					empty_cubs[empty_index++]=AAA[j];
					empty_cubs[empty_index++]=AAA[k];
				}
			}

		}

	}
}